

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall QTextDocumentPrivate::~QTextDocumentPrivate(QTextDocumentPrivate *this)

{
  Span *pSVar1;
  Data *pDVar2;
  _Manager_type p_Var3;
  Data *pDVar4;
  ulong uVar5;
  Data *pDVar6;
  ulong uVar7;
  
  *(undefined ***)this = &PTR__QTextDocumentPrivate_007dcec8;
  pDVar6 = (this->cursors).q_hash.d;
  if (pDVar6 == (Data *)0x0) {
    pDVar6 = (Data *)0x0;
    uVar7 = 0;
LAB_004d084d:
    if (pDVar6 == (Data *)0x0 && uVar7 == 0) goto LAB_004d08cb;
  }
  else {
    if (pDVar6->spans->offsets[0] == 0xff) {
      uVar5 = 1;
      do {
        uVar7 = uVar5;
        if (pDVar6->numBuckets == uVar7) {
          pDVar6 = (Data *)0x0;
          uVar7 = 0;
          break;
        }
        uVar5 = uVar7 + 1;
      } while (pDVar6->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
      goto LAB_004d084d;
    }
    uVar7 = 0;
  }
  do {
    pSVar1 = pDVar6->spans;
    *(undefined8 *)
     (*(long *)pSVar1[uVar7 >> 7].entries[pSVar1[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f]].storage.
               data + 8) = 0;
    do {
      if (pDVar6->numBuckets - 1 == uVar7) {
        pDVar6 = (Data *)0x0;
        uVar7 = 0;
        break;
      }
      uVar7 = uVar7 + 1;
    } while (pSVar1[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
  } while ((pDVar6 != (Data *)0x0) || (uVar7 != 0));
LAB_004d08cb:
  QHash<QTextCursorPrivate_*,_QHashDummyValue>::clear(&(this->cursors).q_hash);
  this->undoState = 0;
  this->undoEnabled = true;
  clearUndoRedoStacks(this,RedoStack,false);
  QUrl::~QUrl(&this->baseUrl);
  pDVar2 = (this->frontMatter).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->frontMatter).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->cssMedia).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->cssMedia).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->url).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->url).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->title).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->title).d.d)->super_QArrayData,2,0x10);
    }
  }
  QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&(this->parsedDefaultStyleSheet).idIndex);
  QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&(this->parsedDefaultStyleSheet).nameIndex);
  QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer
            (&(this->parsedDefaultStyleSheet).importRules.d);
  QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer
            (&(this->parsedDefaultStyleSheet).animationRules.d);
  QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer
            (&(this->parsedDefaultStyleSheet).pageRules.d);
  QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer
            (&(this->parsedDefaultStyleSheet).mediaRules.d);
  QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
            ((QArrayDataPointer<QCss::StyleRule> *)&this->parsedDefaultStyleSheet);
  QTextOption::~QTextOption(&this->defaultTextOption);
  pDVar2 = (this->defaultStyleSheet).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->defaultStyleSheet).d.d)->super_QArrayData,2,0x10);
    }
  }
  p_Var3 = (this->resourceProvider).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->resourceProvider,(_Any_data *)&this->resourceProvider,
              __destroy_functor);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QUrl,_QVariant,_std::less<QUrl>,_std::allocator<std::pair<const_QUrl,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->cachedResources).d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QUrl,_QVariant,_std::less<QUrl>,_std::allocator<std::pair<const_QUrl,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->resources).d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->objects).d);
  QHash<QTextCursorPrivate_*,_QHashDummyValue>::~QHash(&(this->cursors).q_hash);
  QFragmentMap<QTextBlockData>::~QFragmentMap(&this->blocks);
  QFragmentMap<QTextFragmentData>::~QFragmentMap(&this->fragments);
  QTextFormatCollection::~QTextFormatCollection(&this->formats);
  pDVar4 = (this->undoStack).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->undoStack).d.d)->super_QArrayData,0x20,0x10);
    }
  }
  pDVar2 = (this->text).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->text).d.d)->super_QArrayData,2,0x10);
    }
  }
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QTextDocumentPrivate::~QTextDocumentPrivate()
{
    for (QTextCursorPrivate *curs : std::as_const(cursors))
        curs->priv = nullptr;
    cursors.clear();
    undoState = 0;
    undoEnabled = true;
    clearUndoRedoStacks(QTextDocument::RedoStack);
}